

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vod_common.cpp
# Opt level: O0

string * floatToTime_abi_cxx11_(string *__return_storage_ptr__,double time,char msSeparator)

{
  ostream *poVar1;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream str;
  int local_30;
  int local_2c;
  int msec;
  int sec;
  int min;
  int hour;
  int iTime;
  char msSeparator_local;
  double time_local;
  
  sec = (int)time / 0xe10;
  local_2c = (int)time % 0xe10;
  msec = local_2c / 0x3c;
  local_2c = local_2c % 0x3c;
  local_30 = (int)((time - (double)(int)time) * 1000.0);
  min = local_2c;
  hour._3_1_ = msSeparator;
  _iTime = time;
  time_local = (double)__return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  int32ToStr_abi_cxx11_(&local_1e8,&sec);
  strPadLeft(&local_1c8,&local_1e8,2,'0');
  poVar1 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
  std::operator<<(poVar1,':');
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  int32ToStr_abi_cxx11_(&local_238,&msec);
  strPadLeft(&local_218,&local_238,2,'0');
  poVar1 = std::operator<<((ostream *)local_1a8,(string *)&local_218);
  std::operator<<(poVar1,':');
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  int32ToStr_abi_cxx11_(&local_278,&local_2c);
  strPadLeft(&local_258,&local_278,2,'0');
  poVar1 = std::operator<<((ostream *)local_1a8,(string *)&local_258);
  poVar1 = std::operator<<(poVar1,hour._3_1_);
  int32ToStr_abi_cxx11_(&local_2b8,&local_30);
  strPadLeft(&local_298,&local_2b8,3,'0');
  std::operator<<(poVar1,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string floatToTime(const double time, const char msSeparator)
{
    int iTime = static_cast<int>(time);
    const int hour = iTime / 3600;
    iTime -= hour * 3600;
    const int min = iTime / 60;
    iTime -= min * 60;
    const int sec = iTime;
    const int msec = static_cast<int>((time - static_cast<int>(time)) * 1000.0);
    std::ostringstream str;
    str << strPadLeft(int32ToStr(hour), 2, '0') << ':';
    str << strPadLeft(int32ToStr(min), 2, '0') << ':';
    str << strPadLeft(int32ToStr(sec), 2, '0') << msSeparator << strPadLeft(int32ToStr(msec), 3, '0');
    return str.str();
}